

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O0

int SMCompatible_Dense(SUNMatrix A,SUNMatrix B)

{
  SUNMatrix_ID SVar1;
  long *in_RSI;
  SUNMatrix in_RDI;
  int local_4;
  
  SVar1 = SUNMatGetID(in_RDI);
  if (SVar1 == SUNMATRIX_DENSE) {
    SVar1 = SUNMatGetID(in_RDI);
    if (SVar1 == SUNMATRIX_DENSE) {
      if (*in_RDI->content == *(int *)*in_RSI) {
        if (*(int *)((long)in_RDI->content + 4) == *(int *)(*in_RSI + 4)) {
          local_4 = 1;
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static booleantype SMCompatible_Dense(SUNMatrix A, SUNMatrix B)
{
  /* both matrices must be SUNMATRIX_DENSE */
  if (SUNMatGetID(A) != SUNMATRIX_DENSE)
    return SUNFALSE;
  if (SUNMatGetID(B) != SUNMATRIX_DENSE)
    return SUNFALSE;

  /* both matrices must have the same shape */
  if (SM_ROWS_D(A) != SM_ROWS_D(B))
    return SUNFALSE;
  if (SM_COLUMNS_D(A) != SM_COLUMNS_D(B))
    return SUNFALSE;

  return SUNTRUE;
}